

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::
         write_significand<char,fmt::v8::appender,char_const*,fmt::v8::detail::digit_grouping<char>>
                   (appender out,char *significand,int significand_size,int exponent,
                   digit_grouping<char> *grouping)

{
  char cVar1;
  char *s;
  size_t count;
  undefined8 in_RDI;
  digit_grouping<char> *in_R8;
  memory_buffer buffer;
  digit_grouping<char> *in_stack_00000590;
  basic_string_view<char> in_stack_00000598;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_000005a8;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  int count_00;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffd28;
  basic_string_view<char> local_2b8;
  undefined8 local_2a8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_2a0;
  undefined1 local_291;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_288;
  allocator<char> local_261;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_260;
  undefined1 local_41;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_40;
  undefined8 local_38;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_30;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_10;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_8;
  
  count_00 = (int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  local_10.container = (buffer<char> *)in_RDI;
  cVar1 = digit_grouping<char>::separator(in_R8);
  if (cVar1 == '\0') {
    local_38 = local_10.container;
    local_40.container =
         (buffer<char> *)
         write_significand<char,fmt::v8::appender>
                   (in_stack_fffffffffffffd18.container,(char *)in_stack_fffffffffffffd10,
                    in_stack_fffffffffffffd0c);
    local_41 = 0x30;
    local_30.container = local_40.container;
    local_10.container = local_40.container;
    local_8.container =
         (buffer<char> *)
         fill_n<fmt::v8::appender,int,char>
                   (in_stack_fffffffffffffd28.container,count_00,in_stack_fffffffffffffd18.container
                   );
  }
  else {
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd10,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::allocator<char>::~allocator(&local_261);
    appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffd10,
               (buffer<char> *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    local_288.container =
         (buffer<char> *)
         write_significand<char,fmt::v8::appender>
                   (in_stack_fffffffffffffd18.container,(char *)in_stack_fffffffffffffd10,
                    in_stack_fffffffffffffd0c);
    appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffd10,
               (buffer<char> *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    local_291 = 0x30;
    local_2a0.container =
         (buffer<char> *)
         fill_n<fmt::v8::appender,int,char>
                   (in_stack_fffffffffffffd28.container,count_00,in_stack_fffffffffffffd18.container
                   );
    local_2a8 = local_10.container;
    this = &local_260;
    s = buffer<char>::data(&this->super_buffer<char>);
    count = buffer<char>::size(&this->super_buffer<char>);
    basic_string_view<char>::basic_string_view(&local_2b8,s,count);
    local_8.container =
         (buffer<char> *)
         digit_grouping<char>::apply<fmt::v8::appender,char>
                   (in_stack_00000590,in_stack_000005a8.container,in_stack_00000598);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_8.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}